

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Image.c
# Opt level: O3

int Llb_NonlinStart(Llb_Mgr_t *p)

{
  int iVar1;
  void **__ptr;
  Vec_Ptr_t *__ptr_00;
  long lVar2;
  
  __ptr_00 = Llb_NonlinBuildBdds(p->pAig,p->vLeaves,p->vRoots,p->dd);
  if (__ptr_00 == (Vec_Ptr_t *)0x0) {
    return 0;
  }
  iVar1 = __ptr_00->nSize;
  __ptr = __ptr_00->pArray;
  if ((long)iVar1 < 1) {
    if (__ptr == (void **)0x0) goto LAB_00944185;
  }
  else {
    lVar2 = 0;
    do {
      Llb_NonlinAddPartition(p,(int)lVar2,(DdNode *)__ptr[lVar2]);
      lVar2 = lVar2 + 1;
    } while (iVar1 != lVar2);
  }
  free(__ptr);
LAB_00944185:
  free(__ptr_00);
  return 1;
}

Assistant:

int Llb_NonlinStart( Llb_Mgr_t * p )
{
    Vec_Ptr_t * vRootBdds;
    DdNode * bFunc;
    int i;
    // create and collect BDDs
    vRootBdds = Llb_NonlinBuildBdds( p->pAig, p->vLeaves, p->vRoots, p->dd ); // come referenced
    if ( vRootBdds == NULL )
        return 0;
    // add pairs (refs are consumed inside)
    Vec_PtrForEachEntry( DdNode *, vRootBdds, bFunc, i )
        Llb_NonlinAddPartition( p, i, bFunc );
    Vec_PtrFree( vRootBdds );
    return 1;
}